

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O0

Statement *
slang::ast::WhileLoopStatement::fromSyntax
          (Compilation *compilation,LoopStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  sockaddr *__addr;
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  ExpressionSyntax *pEVar4;
  undefined4 extraout_var;
  StatementSyntax *pSVar5;
  undefined4 extraout_var_00;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  Expression *in_RDI;
  WhileLoopStatement *result;
  Statement *bodyStmt;
  Expression *condExpr;
  bool bad;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_Statement_h:162:37)>
  guard;
  Statement *in_stack_fffffffffffffef8;
  Compilation *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  Statement *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff20;
  BumpAllocator *this;
  StatementContext *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff50;
  Expression *in_stack_ffffffffffffff80;
  ASTContext *in_stack_ffffffffffffff88;
  bitmask<slang::ast::ASTFlags> local_68 [3];
  BumpAllocator *local_50;
  byte local_41;
  socklen_t local_28;
  sockaddr *local_20;
  Expression *local_10;
  Compilation *local_8;
  
  local_20 = in_RDX;
  local_10 = in_RDI;
  local_28 = in_ECX;
  Statement::StatementContext::enterLoop
            (in_stack_ffffffffffffff28,SUB81((ulong)in_stack_ffffffffffffff20 >> 0x38,0));
  local_41 = 0;
  pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa3c437);
  __addr = local_20;
  bitmask<slang::ast::ASTFlags>::bitmask(local_68,None);
  iVar3 = Expression::bind((int)pEVar4,__addr,(socklen_t)local_68[0].m_bits);
  local_50 = (BumpAllocator *)CONCAT44(extraout_var,iVar3);
  uVar1 = ASTContext::requireBooleanConvertible(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80)
  ;
  if (!(bool)uVar1) {
    local_41 = 1;
  }
  pSVar5 = not_null<slang::syntax::StatementSyntax_*>::operator*
                     ((not_null<slang::syntax::StatementSyntax_*> *)0xa3c4f0);
  iVar3 = Statement::bind((int)pSVar5,local_20,local_28);
  this = local_50;
  slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)CONCAT17(uVar1,in_stack_ffffffffffffff50));
  local_8 = (Compilation *)
            BumpAllocator::
            emplace<slang::ast::WhileLoopStatement,slang::ast::Expression_const&,slang::ast::Statement_const&,slang::SourceRange>
                      (this,local_10,in_stack_ffffffffffffff10,
                       (SourceRange *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08))
  ;
  if (((local_41 & 1) != 0) ||
     (bVar2 = Statement::bad((Statement *)CONCAT44(extraout_var_00,iVar3)), bVar2)) {
    in_stack_ffffffffffffff00 =
         (Compilation *)Statement::badStmt(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    local_8 = in_stack_ffffffffffffff00;
  }
  ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/Statement.h:162:37)>
  ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_Statement_h:162:37)>
                 *)in_stack_ffffffffffffff00);
  return (Statement *)local_8;
}

Assistant:

Statement& WhileLoopStatement::fromSyntax(Compilation& compilation,
                                          const LoopStatementSyntax& syntax,
                                          const ASTContext& context, StatementContext& stmtCtx) {
    auto guard = stmtCtx.enterLoop();

    bool bad = false;
    auto& condExpr = Expression::bind(*syntax.expr, context);
    if (!context.requireBooleanConvertible(condExpr))
        bad = true;

    auto& bodyStmt = Statement::bind(*syntax.statement, context, stmtCtx);
    auto result = compilation.emplace<WhileLoopStatement>(condExpr, bodyStmt, syntax.sourceRange());

    if (bad || bodyStmt.bad())
        return badStmt(compilation, result);
    return *result;
}